

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transition_row.cc
# Opt level: O0

void __thiscall
transition_row_make_row_t1t2_Test::~transition_row_make_row_t1t2_Test
          (transition_row_make_row_t1t2_Test *this)

{
  transition_row_make_row_t1t2_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(transition_row, make_row_t1t2) {
    const auto row = make_row(t1(), t2());
    static_assert(decltype(row)::size == 2, "");

    EXPECT_TRUE(std::get<0>(row.data()).guard(e1{1}));
    EXPECT_FALSE(std::get<0>(row.data()).guard(e1{0}));

    EXPECT_FALSE(std::get<1>(row.data()).guard(e1{1}));
    EXPECT_TRUE(std::get<1>(row.data()).guard(e1{0}));
}